

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

string * __thiscall
testing::internal::FlagToEnvVar_abi_cxx11_(string *__return_storage_ptr__,internal *this,char *flag)

{
  undefined8 ss;
  int iVar1;
  pointer pcVar2;
  size_t sVar3;
  ostream *poVar4;
  undefined1 local_60 [8];
  string full_flag;
  Message env_var;
  
  Message::Message((Message *)((long)&full_flag.field_2 + 8));
  ss = full_flag.field_2._8_8_;
  poVar4 = (ostream *)(full_flag.field_2._8_8_ + 0x10);
  sVar3 = 6;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"gtest_",6);
  if (this == (internal *)0x0) {
    this = (internal *)"(null)";
  }
  else {
    sVar3 = strlen((char *)this);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)this,sVar3);
  StringStreamToString((string *)local_60,(stringstream *)ss);
  if (ss != 0) {
    (**(code **)(*(long *)ss + 8))(ss);
  }
  Message::Message((Message *)((long)&full_flag.field_2 + 8));
  if (full_flag._M_dataplus._M_p != (pointer)0x0) {
    poVar4 = (ostream *)(full_flag.field_2._8_8_ + 0x10);
    pcVar2 = (pointer)0x0;
    do {
      iVar1 = toupper((uint)*(byte *)((long)local_60 + (long)pcVar2));
      env_var.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._7_1_ = (undefined1)iVar1;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,(char *)((long)&env_var.ss_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                + 7),1);
      pcVar2 = pcVar2 + 1;
    } while (pcVar2 != full_flag._M_dataplus._M_p);
  }
  StringStreamToString(__return_storage_ptr__,(stringstream *)full_flag.field_2._8_8_);
  if (full_flag.field_2._8_8_ != 0) {
    (**(code **)(*(long *)full_flag.field_2._8_8_ + 8))(full_flag.field_2._8_8_);
  }
  if (local_60 != (undefined1  [8])&full_flag._M_string_length) {
    operator_delete((void *)local_60,full_flag._M_string_length + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string FlagToEnvVar(const char* flag) {
  const std::string full_flag =
      (Message() << GTEST_FLAG_PREFIX_ << flag).GetString();

  Message env_var;
  for (size_t i = 0; i != full_flag.length(); i++) {
    env_var << ToUpper(full_flag.c_str()[i]);
  }

  return env_var.GetString();
}